

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrap.cpp
# Opt level: O1

int C_std::Network::easy_bind(int sockfd,int port,string *ip)

{
  int iVar1;
  sockaddr_in addr;
  string local_48;
  sockaddr local_28;
  
  local_28.sa_data[6] = '\0';
  local_28.sa_data[7] = '\0';
  local_28.sa_data[8] = '\0';
  local_28.sa_data[9] = '\0';
  local_28.sa_data[10] = '\0';
  local_28.sa_data[0xb] = '\0';
  local_28.sa_data[0xc] = '\0';
  local_28.sa_data[0xd] = '\0';
  local_28.sa_data._0_2_ = (ushort)port << 8 | (ushort)port >> 8;
  local_28.sa_family = 2;
  local_28.sa_data._2_4_ = 0;
  iVar1 = inet_pton(2,(ip->_M_dataplus)._M_p,local_28.sa_data + 2);
  if (iVar1 == -1) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"af to ip error","");
    perror_exit(&local_48);
  }
  else {
    if (iVar1 != 0) goto LAB_00104420;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"ip convert error","");
    perror_exit(&local_48);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
LAB_00104420:
  iVar1 = Bind(sockfd,&local_28,0x10);
  return iVar1;
}

Assistant:

int easy_bind(int sockfd, int port, const std::string ip) {
            struct sockaddr_in addr;
            memset(&addr, 0, sizeof(addr));
            addr.sin_family = AF_INET;
            addr.sin_port = htons(port);                //需要转换成网络字节序：大端模式
            //如果ip为127.0.0.1，则等价于addr.sin_addr.s_addr = htol(INADDR_ANY);
            int ret = inet_pton(AF_INET, ip.c_str(), &addr.sin_addr.s_addr);
            if (ret == 0) {
                perror_exit("ip convert error");    //src不包含代表指定地址族中有效网络地址的字符串
            } else if(ret == -1){
                perror_exit("af to ip error");            //af不包含有效的地址族
            }
            return Bind(sockfd, reinterpret_cast<struct sockaddr *>(&addr), sizeof(addr));
        }